

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

pair<const_char_*,_const_char_*> __thiscall luna::VM::GetOperandNameAndScope(VM *this,Value *a)

{
  Function *pFVar1;
  bool bVar2;
  int iVar3;
  long in_RSI;
  long *in_RDI;
  Value *key_reg;
  int key_1;
  UpvalueInfo *upvalue_info;
  int index_1;
  String *name;
  int src;
  Value *key;
  int index;
  char *scope_null;
  char *scope_table;
  char *scope_upvalue;
  char *scope_local;
  char *scope_global;
  char *unknown_name;
  long pc;
  Instruction *base;
  Instruction *instruction;
  long reg;
  Function *proto;
  value_type *call;
  Function *in_stack_fffffffffffffec8;
  Function *in_stack_fffffffffffffed0;
  Function *in_stack_ffffffffffffff00;
  char *local_e0;
  UpvalueInfo *local_d8;
  uint local_cc;
  int local_c8;
  uint local_c4;
  char *local_c0;
  String *local_b8;
  uint local_ac;
  int local_a8;
  uint local_a4;
  char *local_a0;
  Value *local_98;
  uint local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  long local_50;
  Instruction *local_48;
  Instruction *local_40;
  Function *local_38;
  Function *local_30;
  reference local_28;
  long local_20;
  pair<const_char_*,_const_char_*> local_10;
  
  local_20 = in_RSI;
  bVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)(*in_RDI + 0x48));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x1ea,
                  "std::pair<const char *, const char *> luna::VM::GetOperandNameAndScope(const Value *) const"
                 );
  }
  local_28 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                       ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                        in_stack_fffffffffffffed0);
  bVar2 = false;
  if (local_28->func_ != (Value *)0x0) {
    bVar2 = (local_28->func_->field_0).obj_ != (GCObject *)0x0;
  }
  if (bVar2) {
    local_30 = Closure::GetPrototype((local_28->func_->field_0).closure_);
    local_38 = (Function *)(local_20 - (long)local_28->register_ >> 4);
    local_40 = local_28->instruction_ + -1;
    local_48 = Function::GetOpCodes(in_stack_fffffffffffffed0);
    local_50 = (long)local_40 - (long)local_48 >> 2;
    local_58 = "?";
    local_60 = "global";
    local_68 = "local";
    local_70 = "upvalue";
    local_78 = "table member";
    local_80 = "";
    do {
      if (local_40 <= local_48) {
        std::pair<const_char_*,_const_char_*>::pair<const_char_*&,_const_char_*&,_true>
                  (&local_10,&local_58,&local_80);
        return local_10;
      }
      local_40 = local_40 + -1;
      local_84 = local_40->opcode_;
      iVar3 = Instruction::GetOpCode((Instruction)local_84);
      pFVar1 = local_38;
      switch(iVar3) {
      case 6:
        local_a4 = local_40->opcode_;
        iVar3 = Instruction::GetParamA((Instruction)local_a4);
        if (pFVar1 == (Function *)(long)iVar3) {
          local_ac = local_40->opcode_;
          local_a8 = Instruction::GetParamB((Instruction)local_ac);
          local_b8 = Function::SearchLocalVar
                               (in_stack_ffffffffffffff00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          if (local_b8 != (String *)0x0) {
            local_c0 = String::GetCStr(local_b8);
            std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*&,_true>
                      (&local_10,&local_c0,&local_68);
            return local_10;
          }
          std::pair<const_char_*,_const_char_*>::pair<const_char_*&,_const_char_*&,_true>
                    (&local_10,&local_58,&local_80);
          return local_10;
        }
        break;
      case 7:
        local_c4 = local_40->opcode_;
        in_stack_fffffffffffffed0 = local_38;
        iVar3 = Instruction::GetParamA((Instruction)local_c4);
        if (in_stack_fffffffffffffed0 == (Function *)(long)iVar3) {
          local_cc = local_40->opcode_;
          local_c8 = Instruction::GetParamB((Instruction)local_cc);
          local_d8 = Function::GetUpvalue
                               (in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
          local_e0 = String::GetCStr(local_d8->name_);
          std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*&,_true>
                    (&local_10,&local_e0,&local_70);
          return local_10;
        }
        break;
      case 9:
        local_88 = local_40->opcode_;
        iVar3 = Instruction::GetParamA((Instruction)local_88);
        if (pFVar1 == (Function *)(long)iVar3) {
          local_90 = local_40->opcode_;
          local_8c = Instruction::GetParamBx((Instruction)local_90);
          local_98 = Function::GetConstValue
                               (in_stack_fffffffffffffed0,
                                (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
          if (local_98->type_ == ValueT_String) {
            local_a0 = String::GetCStr((local_98->field_0).str_);
            std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*&,_true>
                      (&local_10,&local_a0,&local_60);
            return local_10;
          }
          std::pair<const_char_*,_const_char_*>::pair<const_char_*&,_const_char_*&,_true>
                    (&local_10,&local_58,&local_80);
          return local_10;
        }
        break;
      case 0x25:
        in_stack_fffffffffffffec8 = local_38;
        iVar3 = Instruction::GetParamC((Instruction)local_40->opcode_);
        if (in_stack_fffffffffffffec8 == (Function *)(long)iVar3) {
          iVar3 = Instruction::GetParamB((Instruction)local_40->opcode_);
          if (local_28->register_[iVar3].type_ == ValueT_String) {
            String::GetCStr(local_28->register_[iVar3].field_0.str_);
            std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*&,_true>
                      (&local_10,(char **)&stack0xffffffffffffff00,&local_78);
            return local_10;
          }
          std::pair<const_char_*,_const_char_*>::pair<const_char_*&,_const_char_*&,_true>
                    (&local_10,&local_58,&local_78);
          return local_10;
        }
      }
    } while( true );
  }
  __assert_fail("call->func_ && call->func_->closure_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x1ea,
                "std::pair<const char *, const char *> luna::VM::GetOperandNameAndScope(const Value *) const"
               );
}

Assistant:

std::pair<const char *, const char *> VM::GetOperandNameAndScope(const Value *a) const
    {
        GET_CALLINFO_AND_PROTO();

        auto reg = a - call->register_;
        auto instruction = call->instruction_ - 1;
        auto base = proto->GetOpCodes();
        auto pc = instruction - base;
        const char *unknown_name = "?";
        const char *scope_global = "global";
        const char *scope_local = "local";
        const char *scope_upvalue = "upvalue";
        const char *scope_table = "table member";
        const char *scope_null = "";

        // Search last instruction which dst register is reg,
        // and get the name base on the instruction
        while (instruction > base)
        {
            --instruction;
            switch (Instruction::GetOpCode(*instruction)) {
                case OpType_GetGlobal:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto index = Instruction::GetParamBx(*instruction);
                        auto key = proto->GetConstValue(index);
                        if (key->type_ == ValueT_String)
                            return { key->str_->GetCStr(), scope_global };
                        else
                            return { unknown_name, scope_null };
                    }
                    break;
                case OpType_Move:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto src = Instruction::GetParamB(*instruction);
                        auto name = proto->SearchLocalVar(src, pc);
                        if (name)
                            return { name->GetCStr(), scope_local };
                        else
                            return { unknown_name, scope_null };
                    }
                    break;
                case OpType_GetUpvalue:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto index = Instruction::GetParamB(*instruction);
                        auto upvalue_info = proto->GetUpvalue(index);
                        return { upvalue_info->name_->GetCStr(), scope_upvalue };
                    }
                    break;
                case OpType_GetTable:
                    if (reg == Instruction::GetParamC(*instruction))
                    {
                        auto key = Instruction::GetParamB(*instruction);
                        auto key_reg = call->register_ + key;
                        if (key_reg->type_ == ValueT_String)
                            return { key_reg->str_->GetCStr(), scope_table };
                        else
                            return { unknown_name, scope_table };
                    }
                    break;
            }
        }

        return { unknown_name, scope_null };
    }